

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O2

void __thiscall
GrcMasterValueList::AddItem
          (GrcMasterValueList *this,Symbol psym,GdlExpression *pexpValue,int nPR,int munitPR,
          bool fOverride,GrpLineAndFile *lnf,string staDescription)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  GdlAssignment *this_00;
  GdlObject *pgdlobj;
  Symbol psym_local;
  string local_80;
  string local_60;
  pair<GrcSymbolTableEntry_*,_GdlAssignment_*> local_40;
  
  psym_local = psym;
  iVar2 = std::
          _Rb_tree<GrcSymbolTableEntry_*,_std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>,_std::_Select1st<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
          ::find((_Rb_tree<GrcSymbolTableEntry_*,_std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>,_std::_Select1st<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
                  *)this,&psym_local);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->m_valmapEntries)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (GdlAssignment *)operator_new(0x48);
    GdlAssignment::GdlAssignment(this_00,pexpValue,nPR,munitPR,fOverride,lnf);
    local_40.first = psym_local;
    local_40.second = this_00;
    std::
    _Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,GdlAssignment*>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>>
    ::_M_emplace_unique<std::pair<GrcSymbolTableEntry*,GdlAssignment*>&>
              ((_Rb_tree<GrcSymbolTableEntry*,std::pair<GrcSymbolTableEntry*const,GdlAssignment*>,std::_Select1st<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,GdlAssignment*>>>
                *)this,&local_40);
  }
  else {
    p_Var1 = iVar2._M_node[1]._M_parent;
    pgdlobj = &pexpValue->super_GdlObject;
    if (pexpValue == (GdlExpression *)0x0) {
      pgdlobj = (GdlObject *)0x0;
    }
    std::__cxx11::string::string((string *)&local_60,"Duplicate ",(allocator *)&local_40);
    std::__cxx11::string::string((string *)&local_80,(string *)staDescription._M_dataplus._M_p);
    GrcErrorList::AddWarning(&g_errorList,0x9dc,pgdlobj,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    if (((int)p_Var1[1]._M_color < lnf->m_nLinePre && fOverride) ||
       ((lnf->m_nLinePre < (int)p_Var1[1]._M_color && (*(char *)&p_Var1->_M_right == '\0')))) {
      (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,pexpValue,nPR,munitPR,fOverride);
    }
  }
  return;
}

Assistant:

void GrcMasterValueList::AddItem(Symbol psym, GdlExpression * pexpValue,
	int nPR, int munitPR, bool fOverride, GrpLineAndFile const& lnf,
	std::string staDescription)
{
	GdlAssignment * pasgn;
	
	ValueMap::iterator hmit = m_valmapEntries.find(psym);
	if (hmit == m_valmapEntries.end())
	//if (!m_valmapEntries.Retrieve(psym, &pasgn) || !pasgn)
	{
		pasgn = new GdlAssignment(pexpValue, nPR, munitPR, fOverride, lnf);
		ValuePair hmpair;
		hmpair.first = psym;
		hmpair.second = pasgn;
		m_valmapEntries.insert(hmpair);
		//m_valmapEntries.Insert(psym, pasgn);
	}
	else
	{
		pasgn = hmit->second;
		g_errorList.AddWarning(2524, pexpValue,
			"Duplicate ", staDescription);
		
		if ((lnf.PreProcessedLine() > pasgn->PreProcessedLine() && fOverride) ||
			(lnf.PreProcessedLine() < pasgn->PreProcessedLine() && !pasgn->Override()))
		{
			pasgn->Set(pexpValue, nPR, munitPR, fOverride, lnf);
		}
	}
}